

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_get_rows(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  long lVar2;
  size_t sVar3;
  ggml_tensor *pgVar4;
  int64_t iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  code *pcVar14;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  undefined8 uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  
  pgVar1 = dst->src[0];
  switch(pgVar1->type) {
  case GGML_TYPE_F32:
  case GGML_TYPE_I32:
    pgVar4 = dst->src[1];
    iVar5 = pgVar1->ne[0];
    lVar2 = pgVar1->ne[1];
    sVar3 = pgVar1->nb[1];
    sVar6 = dst->nb[3];
    sVar7 = pgVar1->nb[2];
    sVar8 = pgVar4->nb[0];
    sVar9 = pgVar1->nb[3];
    lVar27 = pgVar4->ne[0];
    lVar28 = pgVar4->ne[1];
    sVar10 = pgVar4->nb[1];
    sVar11 = pgVar4->nb[2];
    sVar12 = dst->nb[1];
    sVar13 = dst->nb[2];
    lVar19 = ggml_nelements();
    iVar18 = (int)((lVar19 + -1 + (long)params->nth) / (long)params->nth);
    lVar20 = (long)params->ith * (long)iVar18;
    iVar18 = iVar18 + (int)lVar20;
    if (lVar19 <= iVar18) {
      iVar18 = (int)lVar19;
    }
    if ((int)lVar20 < iVar18) {
      lVar28 = lVar28 * lVar27;
      uVar25 = (uint)iVar5;
      pvVar15 = pgVar4->data;
      do {
        lVar19 = lVar20 / lVar28;
        lVar22 = lVar20 % lVar28;
        lVar26 = lVar22 / lVar27;
        lVar22 = lVar22 % lVar27;
        lVar23 = (long)*(int *)((long)pvVar15 + lVar19 * sVar11 + lVar26 * sVar10 + lVar22 * sVar8);
        if ((lVar23 < 0) || (lVar2 <= lVar23)) {
          uVar24 = 0x10d1;
LAB_0013d219:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                     ,uVar24,"GGML_ASSERT(%s) failed","i01 >= 0 && i01 < ne01");
        }
        if (0 < (int)uVar25) {
          pvVar16 = dst->data;
          pvVar17 = pgVar1->data;
          uVar21 = 0;
          do {
            *(undefined4 *)
             ((long)pvVar16 + uVar21 * 4 + lVar26 * sVar13 + lVar22 * sVar12 + lVar19 * sVar6) =
                 *(undefined4 *)
                  ((long)pvVar17 + uVar21 * 4 + lVar23 * sVar3 + lVar19 * sVar9 + lVar26 * sVar7);
            uVar21 = uVar21 + 1;
          } while ((uVar25 & 0x7fffffff) != uVar21);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar18);
    }
    break;
  case GGML_TYPE_F16:
    pgVar4 = dst->src[1];
    iVar5 = pgVar1->ne[0];
    lVar2 = pgVar1->ne[1];
    sVar3 = pgVar1->nb[1];
    sVar6 = dst->nb[2];
    sVar7 = dst->nb[3];
    sVar8 = pgVar1->nb[2];
    lVar27 = pgVar4->ne[0];
    sVar9 = pgVar1->nb[3];
    lVar28 = pgVar4->ne[1];
    sVar10 = pgVar4->nb[0];
    sVar11 = pgVar4->nb[1];
    sVar12 = pgVar4->nb[2];
    sVar13 = dst->nb[1];
    lVar19 = ggml_nelements(pgVar4);
    iVar18 = (int)((lVar19 + -1 + (long)params->nth) / (long)params->nth);
    lVar20 = (long)params->ith * (long)iVar18;
    iVar18 = iVar18 + (int)lVar20;
    if (lVar19 <= iVar18) {
      iVar18 = (int)lVar19;
    }
    if ((int)lVar20 < iVar18) {
      lVar28 = lVar28 * lVar27;
      do {
        lVar19 = lVar20 / lVar28;
        lVar23 = lVar20 % lVar28;
        lVar26 = lVar23 / lVar27;
        lVar23 = lVar23 % lVar27;
        lVar22 = (long)*(int *)((long)pgVar4->data +
                               lVar19 * sVar12 + lVar26 * sVar11 + lVar23 * sVar10);
        if ((lVar22 < 0) || (lVar2 <= lVar22)) {
          uVar24 = 0x107f;
          goto LAB_0013d219;
        }
        ggml_fp16_to_fp32_row
                  ((long)pgVar1->data + lVar19 * sVar9 + lVar26 * sVar8 + lVar22 * sVar3,
                   (long)dst->data + lVar26 * sVar6 + lVar19 * sVar7 + lVar23 * sVar13,iVar5);
        lVar20 = lVar20 + 1;
      } while (iVar18 != lVar20);
    }
    break;
  case GGML_TYPE_Q4_0:
  case GGML_TYPE_Q4_1:
  case GGML_TYPE_Q5_0:
  case GGML_TYPE_Q5_1:
  case GGML_TYPE_Q8_0:
  case GGML_TYPE_Q8_1:
  case GGML_TYPE_Q2_K:
  case GGML_TYPE_Q3_K:
  case GGML_TYPE_Q4_K:
  case GGML_TYPE_Q5_K:
  case GGML_TYPE_Q6_K:
  case GGML_TYPE_IQ2_XXS:
  case GGML_TYPE_IQ2_XS:
  case GGML_TYPE_IQ3_XXS:
  case GGML_TYPE_IQ1_S:
  case GGML_TYPE_IQ4_NL:
  case GGML_TYPE_IQ3_S:
  case GGML_TYPE_IQ2_S:
  case GGML_TYPE_IQ4_XS:
  case GGML_TYPE_IQ1_M:
  case GGML_TYPE_TQ1_0:
  case GGML_TYPE_TQ2_0:
    lVar2 = pgVar1->ne[1];
    sVar3 = pgVar1->nb[1];
    pgVar4 = dst->src[1];
    iVar5 = pgVar1->ne[0];
    sVar6 = dst->nb[3];
    sVar7 = pgVar1->nb[2];
    sVar8 = pgVar1->nb[3];
    lVar27 = pgVar4->ne[1];
    lVar28 = pgVar4->ne[0];
    sVar9 = pgVar4->nb[0];
    sVar10 = pgVar4->nb[1];
    sVar11 = pgVar4->nb[2];
    sVar12 = dst->nb[1];
    sVar13 = dst->nb[2];
    lVar19 = ggml_nelements(pgVar4);
    lVar20 = ggml_get_type_traits(pgVar1->type);
    iVar18 = (int)((lVar19 + -1 + (long)params->nth) / (long)params->nth);
    lVar26 = (long)params->ith * (long)iVar18;
    iVar18 = iVar18 + (int)lVar26;
    if (lVar19 <= iVar18) {
      iVar18 = (int)lVar19;
    }
    if ((int)lVar26 < iVar18) {
      lVar27 = lVar27 * lVar28;
      pcVar14 = *(code **)(lVar20 + 0x28);
      do {
        lVar19 = lVar26 / lVar27;
        lVar23 = lVar26 % lVar27;
        lVar20 = lVar23 / lVar28;
        lVar23 = lVar23 % lVar28;
        lVar22 = (long)*(int *)((long)pgVar4->data +
                               lVar19 * sVar11 + lVar20 * sVar10 + lVar23 * sVar9);
        if ((lVar22 < 0) || (lVar2 <= lVar22)) {
          uVar24 = 0x1056;
          goto LAB_0013d219;
        }
        (*pcVar14)((long)pgVar1->data + lVar19 * sVar8 + lVar20 * sVar7 + lVar22 * sVar3,
                   (long)dst->data + lVar20 * sVar13 + lVar19 * sVar6 + lVar23 * sVar12,iVar5);
        lVar26 = lVar26 + 1;
      } while (iVar18 != lVar26);
    }
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0x1108,"fatal error");
  case GGML_TYPE_BF16:
    pgVar4 = dst->src[1];
    iVar5 = pgVar1->ne[0];
    lVar2 = pgVar1->ne[1];
    sVar3 = pgVar1->nb[1];
    sVar6 = dst->nb[2];
    sVar7 = dst->nb[3];
    sVar8 = pgVar1->nb[2];
    lVar27 = pgVar4->ne[0];
    sVar9 = pgVar1->nb[3];
    lVar28 = pgVar4->ne[1];
    sVar10 = pgVar4->nb[0];
    sVar11 = pgVar4->nb[1];
    sVar12 = pgVar4->nb[2];
    sVar13 = dst->nb[1];
    lVar19 = ggml_nelements(pgVar4);
    iVar18 = (int)((lVar19 + -1 + (long)params->nth) / (long)params->nth);
    lVar20 = (long)params->ith * (long)iVar18;
    iVar18 = iVar18 + (int)lVar20;
    if (lVar19 <= iVar18) {
      iVar18 = (int)lVar19;
    }
    if ((int)lVar20 < iVar18) {
      lVar28 = lVar28 * lVar27;
      do {
        lVar19 = lVar20 / lVar28;
        lVar23 = lVar20 % lVar28;
        lVar26 = lVar23 / lVar27;
        lVar23 = lVar23 % lVar27;
        lVar22 = (long)*(int *)((long)pgVar4->data +
                               lVar19 * sVar12 + lVar26 * sVar11 + lVar23 * sVar10);
        if ((lVar22 < 0) || (lVar2 <= lVar22)) {
          uVar24 = 0x10a8;
          goto LAB_0013d219;
        }
        ggml_bf16_to_fp32_row
                  ((long)pgVar1->data + lVar19 * sVar9 + lVar26 * sVar8 + lVar22 * sVar3,
                   (long)dst->data + lVar26 * sVar6 + lVar19 * sVar7 + lVar23 * sVar13,iVar5);
        lVar20 = lVar20 + 1;
      } while (iVar18 != lVar20);
    }
  }
  return;
}

Assistant:

void ggml_compute_forward_get_rows(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q8_1:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
            {
                ggml_compute_forward_get_rows_q(params, dst);
            } break;
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_get_rows_f16(params, dst);
            } break;
        case GGML_TYPE_BF16:
            {
                ggml_compute_forward_get_rows_bf16(params, dst);
            } break;
        case GGML_TYPE_F32:
        case GGML_TYPE_I32:
            {
                ggml_compute_forward_get_rows_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }

    //static bool first = true;
    //printf("ne0 = %d, ne1 = %d, ne2 = %d\n", dst->ne[0], dst->ne[1], dst->ne[2]);
    //if (first) {
    //    first = false;
    //} else {
    //    for (int k = 0; k < dst->ne[1]; ++k) {
    //        for (int j = 0; j < dst->ne[0]/16; ++j) {
    //            for (int i = 0; i < 16; ++i) {
    //                printf("%8.4f ", ((float *) dst->data)[k*dst->ne[0] + j*16 + i]);
    //            }
    //            printf("\n");
    //        }
    //        printf("\n");
    //    }
    //    printf("\n");
    //    exit(0);
    //}
}